

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_check_requires(nn_parse_context *ctx)

{
  nn_option *pnVar1;
  nn_option *pnVar2;
  long lVar3;
  
  if (ctx->options->longname != (char *)0x0) {
    lVar3 = 0;
    pnVar1 = ctx->options;
    do {
      pnVar2 = pnVar1 + 1;
      if (((ctx->last_option_usage[lVar3] != (char *)0x0) && (pnVar1->requires_mask != 0)) &&
         ((pnVar1->requires_mask & ~ctx->mask) != 0)) {
        nn_check_requires_cold_1();
        goto LAB_001045bb;
      }
      lVar3 = lVar3 + 1;
      pnVar1 = pnVar2;
    } while (pnVar2->longname != (char *)0x0);
  }
  if ((ctx->requires & ~ctx->mask) == 0) {
    return;
  }
LAB_001045bb:
  nn_check_requires_cold_2();
}

Assistant:

void nn_check_requires (struct nn_parse_context *ctx) {
    int i;
    struct nn_option *opt;

    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (!ctx->last_option_usage[i])
            continue;
        if (opt->requires_mask &&
            (opt->requires_mask & ctx->mask) != opt->requires_mask) {
            nn_option_requires (ctx, i);
        }
    }

    if ((ctx->requires & ctx->mask) != ctx->requires) {
        fprintf (stderr, "%s: At least one of the following required:\n",
            ctx->argv[0]);
        nn_print_requires (ctx, ctx->requires & ~ctx->mask);
        exit (1);
    }
}